

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snippet.cpp
# Opt level: O3

void __thiscall
cpptrace::detail::snippet_manager::snippet_manager(snippet_manager *this,string *path)

{
  char cVar1;
  long lVar2;
  ifstream file;
  string asStack_228 [520];
  
  this->loaded_contents = false;
  (this->contents)._M_dataplus._M_p = (pointer)&(this->contents).field_2;
  (this->contents)._M_string_length = 0;
  (this->contents).field_2._M_local_buf[0] = '\0';
  (this->line_table).
  super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->line_table).
  super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->line_table).
  super__Vector_base<cpptrace::detail::line_range,_std::allocator<cpptrace::detail::line_range>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(asStack_228);
  std::ifstream::open(asStack_228,(_Ios_Openmode)path);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    lVar2 = std::istream::tellg();
    if (lVar2 < 0xa00001 && lVar2 != -1) {
      std::istream::seekg((long)asStack_228,_S_beg);
      std::__cxx11::string::resize((ulong)&this->contents,(char)lVar2);
      std::istream::read((char *)asStack_228,(long)(this->contents)._M_dataplus._M_p);
      build_line_table(this);
      this->loaded_contents = true;
    }
  }
  std::ifstream::~ifstream(asStack_228);
  return;
}

Assistant:

snippet_manager(const std::string& path) : loaded_contents(false) {
            std::ifstream file;
            try {
                file.open(path, std::ios::ate);
                if(file.is_open()) {
                    std::ifstream::pos_type size = file.tellg();
                    if(size == std::ifstream::pos_type(-1) || size > max_size) {
                        return;
                    }
                    // else load file
                    file.seekg(0, std::ios::beg);
                    contents.resize(to<std::size_t>(size));
                    if(!file.read(&contents[0], size)) {
                        // error ...
                    }
                    build_line_table();
                    loaded_contents = true;
                }
            } catch(const std::ifstream::failure&) {
                // ...
            }
        }